

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

int nni_url_canonify_uri(char *out)

{
  ushort **ppuVar1;
  __int32_t **pp_Var2;
  long lVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  bool bVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  char cVar16;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined1 auVar17 [16];
  
  auVar17 = ZEXT416(0x2d5f7e2e);
  cVar22 = auVar17[3];
  cVar20 = auVar17[2];
  cVar18 = auVar17[1];
  cVar9 = auVar17[0];
  lVar14 = 0;
  lVar13 = 0;
  do {
    for (; cVar16 = out[lVar13], cVar16 != '%'; lVar13 = lVar13 + 1) {
      if (cVar16 == '\0') {
        out[lVar14] = '\0';
        bVar7 = false;
        lVar13 = 0;
        lVar14 = 0;
        while( true ) {
          cVar9 = out[lVar14];
          lVar3 = lVar13;
          lVar5 = lVar14;
          while (cVar9 == '/') {
            if (bVar7) goto LAB_0011919c;
            out[lVar3] = '/';
            lVar5 = lVar5 + -1;
            do {
              cVar9 = out[lVar5 + 1];
              lVar5 = lVar5 + 1;
            } while (cVar9 == '/');
            lVar3 = lVar3 + 1;
          }
          if (cVar9 == '\0') break;
          lVar13 = lVar3;
          lVar14 = lVar5;
          if ((cVar9 == '#') || (cVar9 == '?')) {
LAB_0011919c:
            bVar7 = true;
            lVar3 = lVar13;
            lVar5 = lVar14;
          }
          out[lVar3] = cVar9;
          lVar13 = lVar3 + 1;
          lVar14 = lVar5 + 1;
        }
        out[lVar3] = '\0';
        bVar7 = false;
        lVar13 = 0;
        lVar14 = 0;
LAB_001191c6:
        uVar10 = (ulong)(byte)out[lVar14];
        lVar5 = lVar14;
        lVar3 = lVar13;
LAB_001191d0:
        lVar12 = lVar5 + 3;
        do {
          cVar9 = (char)uVar10;
          if (cVar9 != '/') {
            iVar11 = (int)uVar10;
            if (iVar11 == 0) {
              out[lVar3] = '\0';
              bVar6 = *out;
              if (bVar6 == 0) {
                return 0;
              }
              while (-1 < (char)bVar6) {
                out = (char *)((byte *)out + 1);
                bVar6 = *out;
                if (bVar6 == 0) {
                  return 0;
                }
              }
              if ((((bVar6 & 0xe0) != 0xc0) && ((bVar6 & 0xf0) != 0xe0)) && ((bVar6 & 0xf8) != 0xf0)
                 ) {
                return 3;
              }
              return 3;
            }
            lVar13 = lVar3;
            lVar14 = lVar5;
            if ((iVar11 == 0x23) || (iVar11 == 0x3f)) goto LAB_00119270;
LAB_0011927d:
            lVar14 = lVar12 + -3;
            lVar13 = lVar3;
LAB_00119280:
            out[lVar13] = cVar9;
            lVar14 = lVar14 + 1;
            lVar13 = lVar13 + 1;
            goto LAB_001191c6;
          }
          if (bVar7) {
LAB_00119270:
            bVar7 = true;
            goto LAB_00119280;
          }
          if (((out[lVar12 + -2] == '.') && (out[lVar12 + -1] == '.')) &&
             ((uVar10 = (ulong)(byte)out[lVar12], uVar10 < 0x40 &&
              ((0x8000800800000001U >> (uVar10 & 0x3f) & 1) != 0)))) goto LAB_00119229;
          if (out[lVar12 + -2] != '.') {
            cVar9 = '/';
            bVar7 = false;
            goto LAB_0011927d;
          }
          uVar10 = (ulong)(byte)out[lVar12 + -1];
          if ((0x3f < uVar10) || ((0x8000800800000001U >> (uVar10 & 0x3f) & 1) == 0)) {
            cVar9 = '/';
            bVar7 = false;
            lVar13 = lVar3;
            lVar14 = lVar5;
            goto LAB_00119280;
          }
          lVar12 = lVar12 + 2;
          lVar5 = lVar5 + 2;
        } while( true );
      }
      out[lVar14] = cVar16;
      lVar14 = lVar14 + 1;
    }
    ppuVar1 = __ctype_b_loc();
    cVar16 = out[lVar13 + 1];
    if ((*(byte *)((long)*ppuVar1 + (long)cVar16 * 2 + 1) & 0x10) == 0) {
      return 3;
    }
    cVar19 = out[lVar13 + 2];
    if ((*(byte *)((long)*ppuVar1 + (long)cVar19 * 2 + 1) & 0x10) == 0) {
      return 3;
    }
    bVar6 = cVar16 - 0x30;
    if (9 < bVar6) {
      if ((byte)(cVar16 + 0xbfU) < 6) {
        bVar6 = cVar16 - 0x37;
      }
      else {
        bVar6 = cVar16 + 0xa9;
        if (5 < (byte)(cVar16 + 0x9fU)) {
          bVar6 = 0;
        }
      }
    }
    bVar4 = cVar19 - 0x30;
    if (9 < bVar4) {
      if ((byte)(cVar19 + 0xbfU) < 6) {
        bVar4 = cVar19 - 0x37;
      }
      else {
        bVar4 = cVar19 + 0xa9;
        if (5 < (byte)(cVar19 + 0x9fU)) {
          bVar4 = 0;
        }
      }
    }
    bVar4 = bVar4 | bVar6 << 4;
    if ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a) {
LAB_001190cc:
      out[lVar14] = bVar4;
      lVar14 = lVar14 + 1;
    }
    else {
      auVar17 = pshuflw(ZEXT216(CONCAT11(bVar4,bVar4)),ZEXT216(CONCAT11(bVar4,bVar4)),0);
      cVar23 = auVar17[3];
      cVar21 = auVar17[2];
      cVar19 = auVar17[1];
      cVar16 = auVar17[0];
      auVar17[0] = -(cVar16 == cVar9);
      auVar17[1] = -(cVar16 == cVar9);
      auVar17[2] = -(cVar16 == cVar9);
      auVar17[3] = -(cVar16 == cVar9);
      auVar17[4] = -(cVar19 == cVar18);
      auVar17[5] = -(cVar19 == cVar18);
      auVar17[6] = -(cVar19 == cVar18);
      auVar17[7] = -(cVar19 == cVar18);
      auVar17[8] = -(cVar21 == cVar20);
      auVar17[9] = -(cVar21 == cVar20);
      auVar17[10] = -(cVar21 == cVar20);
      auVar17[0xb] = -(cVar21 == cVar20);
      auVar17[0xc] = -(cVar23 == cVar22);
      auVar17[0xd] = -(cVar23 == cVar22);
      auVar17[0xe] = -(cVar23 == cVar22);
      auVar17[0xf] = -(cVar23 == cVar22);
      iVar11 = movmskps((uint)bVar4,auVar17);
      if (((iVar11 != 0) || ((char)(bVar6 << 4) < '\0')) || (2 < bVar6 && bVar4 < 0x3a))
      goto LAB_001190cc;
      out[lVar14] = '%';
      pp_Var2 = __ctype_toupper_loc();
      out[lVar14 + 1] = (char)(*pp_Var2)[(byte)out[lVar13 + 1]];
      out[lVar14 + 2] = (char)(*pp_Var2)[(byte)out[lVar13 + 2]];
      lVar14 = lVar14 + 3;
    }
    lVar13 = lVar13 + 3;
  } while( true );
LAB_00119229:
  bVar15 = lVar3 != 0;
  lVar8 = lVar3;
  lVar5 = lVar12;
  lVar3 = 0;
  if (bVar15) {
    do {
      if (lVar8 == 1) {
        lVar3 = 0;
        break;
      }
      lVar3 = lVar8 + -1;
      lVar12 = lVar8 + -1;
      lVar8 = lVar3;
    } while (out[lVar12] != '/');
  }
  goto LAB_001191d0;
}

Assistant:

int
nni_url_canonify_uri(char *out)
{
	size_t  src, dst;
	uint8_t c;
	int     rv;
	bool    skip;

	// First pass, convert '%xx' for safe characters to unescaped forms.
	src = dst = 0;
	while ((c = out[src]) != 0) {
		if (c == '%') {
			if ((!isxdigit(out[src + 1])) ||
			    (!isxdigit(out[src + 2]))) {
				return (NNG_EINVAL);
			}
			c = url_hex_val(out[src + 1]);
			c *= 16;
			c += url_hex_val(out[src + 2]);
			// If it's a safe character, decode, otherwise leave
			// it alone.  We also decode valid high-bytes for
			// UTF-8, which will let us validate them and use
			// those characters in file names later.
			if (((c >= 'A') && (c <= 'Z')) ||
			    ((c >= 'a') && (c <= 'z')) ||
			    ((c >= '0') && (c <= '9')) || (c == '.') ||
			    (c == '~') || (c == '_') || (c == '-') ||
			    (c >= 0x80)) {
				out[dst++] = (char) c;
			} else {
				out[dst++] = '%';
				out[dst++] = toupper((uint8_t) out[src + 1]);
				out[dst++] = toupper((uint8_t) out[src + 2]);
			}
			src += 3;
			continue;
		} else {
			out[dst++] = out[src++];
		}
	}
	out[dst] = 0;

	// Second pass, eliminate redundant //.
	src = dst = 0;
	skip      = false;
	while ((c = out[src]) != 0) {
		if ((c == '/') && (!skip)) {
			out[dst++] = '/';
			while (out[src] == '/') {
				src++;
			}
			continue;
		}
		if ((c == '?') || (c == '#')) {
			skip = true;
		}
		out[dst++] = (char) c;
		src++;
	}
	out[dst] = 0;

	// Second pass, reduce /. and /.. elements, but only in the path.
	src = dst = 0;
	skip      = false;
	while ((c = out[src]) != 0) {
		if ((c == '/') && (!skip)) {
			if ((strncmp(out + src, "/..", 3) == 0) &&
			    (out[src + 3] == 0 || out[src + 3] == '#' ||
			        out[src + 3] == '?' || out[src + 3] == '/')) {

				if (dst > 0) {
					do {
						dst--;
					} while ((dst) && (out[dst] != '/'));
				}
				src += 3;
				continue;
			}
			if ((strncmp(out + src, "/.", 2) == 0) &&
			    (out[src + 2] == 0 || out[src + 2] == '#' ||
			        out[src + 2] == '?' || out[src + 2] == '/')) {
				src += 2; // just skip over it
				continue;
			}
			out[dst++] = '/';
			src++;
		} else {
			if ((c == '?') || (c == '#')) {
				skip = true;
			}
			out[dst++] = (char) c;
			src++;
		}
	}
	out[dst] = 0;

	// Finally lets make sure that the results are valid UTF-8.
	// This guards against using UTF-8 redundancy to break security.
	if ((rv = url_utf8_validate(out)) != 0) {
		return (rv);
	}

	return (0);
}